

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::anon_unknown_1::BaseRenderingCase::init
          (BaseRenderingCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  RenderTarget *pRVar3;
  NotSupportedError *pNVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  RenderContext *pRVar5;
  undefined4 extraout_var_01;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  ShaderProgram *this_00;
  ProgramSources *pPVar8;
  TestError *this_01;
  allocator<char> local_a71;
  string local_a70;
  undefined1 local_a49;
  string local_a48;
  ShaderSource local_a28;
  string local_a00;
  ShaderSource local_9e0;
  ProgramSources local_9b8;
  undefined1 local_8e8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  string local_8b0;
  undefined1 local_890 [8];
  StringTemplate fragmentSource;
  string local_868;
  undefined1 local_848 [8];
  StringTemplate vertexSource;
  MessageBuilder local_6a8;
  MessageBuilder local_528;
  undefined1 local_3a1;
  string local_3a0;
  allocator<char> local_379;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  float local_318;
  float local_314;
  float range_1 [2];
  string local_188;
  allocator<char> local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  float local_fc;
  float local_f8;
  float range [2];
  string local_d0;
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int local_18;
  int local_14;
  int height;
  int width;
  BaseRenderingCase *this_local;
  
  _height = this;
  pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
  local_14 = tcu::RenderTarget::getWidth(pRVar3);
  pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
  local_18 = tcu::RenderTarget::getHeight(pRVar3);
  if ((local_14 < this->m_renderSize) || (local_18 < this->m_renderSize)) {
    range[0]._3_1_ = 1;
    pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"Render target size must be at least ",&local_99);
    de::toString<int>(&local_d0,&this->m_renderSize);
    std::operator+(&local_78,&local_98,&local_d0);
    std::operator+(&local_58,&local_78,"x");
    de::toString<int>((string *)(range + 1),&this->m_renderSize);
    std::operator+(&local_38,&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(range + 1))
    ;
    tcu::NotSupportedError::NotSupportedError(pNVar4,&local_38);
    range[0]._3_1_ = 0;
    __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if ((this->m_lineWidth != 1.0) || (NAN(this->m_lineWidth))) {
    memset(&local_fc,0,8);
    pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
    iVar2 = (*pRVar5->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x818))(0x846e,&local_fc);
    if ((this->m_lineWidth < local_fc) || (local_f8 < this->m_lineWidth)) {
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,"Support for line width ",&local_161);
      de::toString<float>(&local_188,&this->m_lineWidth);
      std::operator+(&local_140,&local_160,&local_188);
      std::operator+(&local_120,&local_140," is required.");
      tcu::NotSupportedError::NotSupportedError(pNVar4,&local_120);
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)range_1,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)range_1,(char (*) [29])"ALIASED_LINE_WIDTH_RANGE = [");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_fc);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0xafd70f);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_f8);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0xacaf61);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)range_1);
  }
  if ((this->m_pointSize != 1.0) || (NAN(this->m_pointSize))) {
    memset(&local_318,0,8);
    pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
    iVar2 = (*pRVar5->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x818))(0x846d,&local_318);
    if ((this->m_pointSize < local_318) || (local_314 < this->m_pointSize)) {
      local_3a1 = 1;
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_378,"Support for point size ",&local_379);
      de::toString<float>(&local_3a0,&this->m_pointSize);
      std::operator+(&local_358,&local_378,&local_3a0);
      std::operator+(&local_338,&local_358," is required.");
      tcu::NotSupportedError::NotSupportedError(pNVar4,&local_338);
      local_3a1 = 0;
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_528,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_528,(char (*) [29])"ALIASED_POINT_SIZE_RANGE = [");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_318);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0xafd70f);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_314);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0xacaf61);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_528);
  }
  pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = tcu::RenderTarget::getNumSamples(pRVar3);
  this->m_numSamples = iVar2;
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_01,iVar2) + 0x868))(0xd50,&this->m_subpixelBits);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_6a8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_6a8,(char (*) [16])"Sample count = ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&this->m_numSamples);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_6a8);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pMVar7 = (MessageBuilder *)((long)&vertexSource.m_template.field_2 + 8);
  tcu::TestLog::operator<<(pMVar7,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [17])"SUBPIXEL_BITS = ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&this->m_subpixelBits);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder
            ((MessageBuilder *)((long)&vertexSource.m_template.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_868,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_color;\nvarying highp vec4 v_color;\nuniform highp float u_pointSize;\nvoid main ()\n{\n\tgl_Position = a_position;\n\tgl_PointSize = u_pointSize;\n\tv_color = a_color;\n}\n"
             ,(allocator<char> *)(fragmentSource.m_template.field_2._M_local_buf + 0xf));
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_848,&local_868);
  std::__cxx11::string::~string((string *)&local_868);
  std::allocator<char>::~allocator
            ((allocator<char> *)(fragmentSource.m_template.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8b0,
             "varying mediump vec4 v_color;\nvoid main ()\n{\n\tgl_FragColor = v_color;\n}\n",
             (allocator<char> *)((long)&params._M_t._M_impl.super__Rb_tree_header._M_node_count + 7)
            );
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_890,&local_8b0);
  std::__cxx11::string::~string((string *)&local_8b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&params._M_t._M_impl.super__Rb_tree_header._M_node_count + 7)
            );
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_8e8);
  this_00 = (ShaderProgram *)operator_new(0xd0);
  local_a49 = 1;
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_9b8);
  tcu::StringTemplate::specialize
            (&local_a00,(StringTemplate *)local_848,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_8e8);
  glu::VertexSource::VertexSource((VertexSource *)&local_9e0,&local_a00);
  pPVar8 = glu::ProgramSources::operator<<(&local_9b8,&local_9e0);
  tcu::StringTemplate::specialize
            (&local_a48,(StringTemplate *)local_890,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_8e8);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_a28,&local_a48);
  pPVar8 = glu::ProgramSources::operator<<(pPVar8,&local_a28);
  glu::ShaderProgram::ShaderProgram(this_00,pRVar5,pPVar8);
  local_a49 = 0;
  this->m_shader = this_00;
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_a28);
  std::__cxx11::string::~string((string *)&local_a48);
  glu::VertexSource::~VertexSource((VertexSource *)&local_9e0);
  std::__cxx11::string::~string((string *)&local_a00);
  glu::ProgramSources::~ProgramSources(&local_9b8);
  bVar1 = glu::ShaderProgram::isOk(this->m_shader);
  if (bVar1) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_8e8);
    tcu::StringTemplate::~StringTemplate((StringTemplate *)local_890);
    tcu::StringTemplate::~StringTemplate((StringTemplate *)local_848);
    return extraout_EAX;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a70,"could not create shader",&local_a71);
  tcu::TestError::TestError(this_01,&local_a70);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void BaseRenderingCase::init (void)
{
	const int width	 = m_context.getRenderTarget().getWidth();
	const int height = m_context.getRenderTarget().getHeight();

	// Requirements

	if (width < m_renderSize || height < m_renderSize)
		throw tcu::NotSupportedError(std::string("Render target size must be at least ") + de::toString(m_renderSize) + "x" + de::toString(m_renderSize));

	if (m_lineWidth != 1.0f)
	{
		float range[2] = { 0.0f, 0.0f };
		m_context.getRenderContext().getFunctions().getFloatv(GL_ALIASED_LINE_WIDTH_RANGE, range);

		if (m_lineWidth < range[0] || m_lineWidth > range[1])
			throw tcu::NotSupportedError(std::string("Support for line width ") + de::toString(m_lineWidth) + " is required.");

		m_testCtx.getLog() << tcu::TestLog::Message << "ALIASED_LINE_WIDTH_RANGE = [" << range[0] << ", " << range[1] << "]" << tcu::TestLog::EndMessage;
	}

	if (m_pointSize != 1.0f)
	{
		float range[2] = { 0.0f, 0.0f };
		m_context.getRenderContext().getFunctions().getFloatv(GL_ALIASED_POINT_SIZE_RANGE, range);

		if (m_pointSize < range[0] || m_pointSize > range[1])
			throw tcu::NotSupportedError(std::string("Support for point size ") + de::toString(m_pointSize) + " is required.");

		m_testCtx.getLog() << tcu::TestLog::Message << "ALIASED_POINT_SIZE_RANGE = [" << range[0] << ", " << range[1] << "]" << tcu::TestLog::EndMessage;
	}

	// Query info

	m_numSamples = m_context.getRenderTarget().getNumSamples();
	m_context.getRenderContext().getFunctions().getIntegerv(GL_SUBPIXEL_BITS, &m_subpixelBits);

	m_testCtx.getLog() << tcu::TestLog::Message << "Sample count = " << m_numSamples << tcu::TestLog::EndMessage;
	m_testCtx.getLog() << tcu::TestLog::Message << "SUBPIXEL_BITS = " << m_subpixelBits << tcu::TestLog::EndMessage;

	// Gen shader

	{
		tcu::StringTemplate					vertexSource	(s_shaderVertexTemplate);
		tcu::StringTemplate					fragmentSource	(s_shaderFragmentTemplate);
		std::map<std::string, std::string>	params;

		m_shader = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(vertexSource.specialize(params)) << glu::FragmentSource(fragmentSource.specialize(params)));
		if (!m_shader->isOk())
			throw tcu::TestError("could not create shader");
	}
}